

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadElemSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  char *pcVar4;
  uint local_a0;
  Enum local_9c;
  Index func_index_1;
  Enum local_94;
  uint local_90;
  Enum local_8c;
  Index func_index;
  Opcode local_84;
  uint local_80;
  Opcode opcode;
  Index j;
  uint local_74;
  Enum local_70;
  Index num_elem_exprs;
  Type local_68;
  Enum local_64;
  ExternalKind local_60;
  Enum local_5c;
  ExternalKind kind;
  Enum local_54;
  Enum local_50;
  Enum local_4c;
  Type local_48;
  Enum local_44;
  Type elem_type;
  Index table_index;
  uint local_34;
  uint32_t flags;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_elem_segments;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_elem_segments = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x86])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    i = (Index)ReadCount(this,&local_28,"elem segment count");
    bVar1 = Failed((Result)i);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      flags = (*this->delegate_->_vptr_BinaryReaderDelegate[0x87])();
      bVar1 = Succeeded((Result)flags);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        for (local_34 = 0; local_34 < local_28; local_34 = local_34 + 1) {
          RVar2 = ReadU32Leb128(this,&table_index,"elem segment flags");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          if (7 < table_index) {
            PrintError(this,"invalid elem segment flags: %#x",(ulong)table_index);
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          elem_type.enum_ = Any;
          if ((table_index & 3) == 2) {
            local_44 = (Enum)ReadIndex(this,(Index *)&elem_type,"elem segment table index");
            bVar1 = Failed((Result)local_44);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          Type::Type(&local_48,Funcref);
          local_4c = (*this->delegate_->_vptr_BinaryReaderDelegate[0x88])
                               (this->delegate_,(ulong)local_34,(ulong)(uint)elem_type.enum_,
                                (ulong)(byte)table_index);
          bVar1 = Succeeded((Result)local_4c);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"BeginElemSegment callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          if ((table_index & 1) == 0) {
            local_50 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x89])
                                 (this->delegate_,(ulong)local_34);
            bVar1 = Succeeded((Result)local_50);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"BeginElemSegmentInitExpr callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            local_54 = (Enum)ReadI32InitExpr(this,local_34);
            bVar1 = Failed((Result)local_54);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            kind = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8a])
                             (this->delegate_,(ulong)local_34);
            bVar1 = Succeeded((Result)kind);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"EndElemSegmentInitExpr callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          if ((table_index & 3) != 0) {
            if ((table_index & 4) == 0) {
              local_64 = (Enum)ReadExternalKind(this,&local_60,"export kind");
              bVar1 = Failed((Result)local_64);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              if (local_60 != First) {
                pcVar4 = Type::GetName(&local_48);
                PrintError(this,"segment elem type must be func (%s)",pcVar4);
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              Type::Type(&local_68,Funcref);
              local_48.enum_ = local_68.enum_;
            }
            else {
              local_5c = (Enum)ReadType(this,&local_48,"table elem type");
              bVar1 = Failed((Result)local_5c);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              bVar1 = Type::IsRef(&local_48);
              if (!bVar1) {
                pcVar4 = Type::GetName(&local_48);
                PrintError(this,"segment elem expr type must be a reference type (got %s)",pcVar4);
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
          }
          local_70 = local_48.enum_;
          num_elem_exprs =
               (*this->delegate_->_vptr_BinaryReaderDelegate[0x8b])
                         (this->delegate_,(ulong)local_34,(ulong)(uint)local_48.enum_);
          bVar1 = Succeeded((Result)num_elem_exprs);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnElemSegmentElemType callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2 = ReadCount(this,&local_74,"elem count");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          opcode.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8c])
                                   (this->delegate_,(ulong)local_34,(ulong)local_74);
          bVar1 = Succeeded((Result)opcode.enum_);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnElemSegmentElemExprCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          for (local_80 = 0; local_80 < local_74; local_80 = local_80 + 1) {
            if ((table_index & 4) == 0) {
              RVar2 = ReadIndex(this,&local_a0,"elem expr func index");
              bVar1 = Failed(RVar2);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8e])
                                      (this->delegate_,(ulong)local_34,(ulong)local_a0);
              bVar1 = Succeeded(RVar2);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                PrintError(this,"OnElemSegmentElemExpr_RefFunc callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            else {
              func_index = (Index)ReadOpcode(this,&local_84,"elem expr opcode");
              bVar1 = Failed((Result)func_index);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              EVar3 = Opcode::operator_cast_to_Enum(&local_84);
              if (EVar3 == RefNull) {
                local_8c = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8d])
                                     (this->delegate_,(ulong)local_34);
                bVar1 = Succeeded((Result)local_8c);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  PrintError(this,"OnElemSegmentElemExpr_RefNull callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  return (Result)this_local._4_4_;
                }
              }
              else {
                EVar3 = Opcode::operator_cast_to_Enum(&local_84);
                if (EVar3 == RefFunc) {
                  local_94 = (Enum)ReadIndex(this,&local_90,"elem expr func index");
                  bVar1 = Failed((Result)local_94);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    return (Result)this_local._4_4_;
                  }
                  func_index_1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8e])
                                           (this->delegate_,(ulong)local_34,(ulong)local_90);
                  bVar1 = Succeeded((Result)func_index_1);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    PrintError(this,"OnElemSegmentElemExpr_RefFunc callback failed");
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    return (Result)this_local._4_4_;
                  }
                }
                else {
                  PrintError(this,"expected ref.null or ref.func in passive element segment");
                }
              }
              local_9c = (Enum)ReadOpcode(this,&local_84,"opcode");
              bVar1 = Failed((Result)local_9c);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              EVar3 = Opcode::operator_cast_to_Enum(&local_84);
              if (EVar3 != End) {
                PrintError(this,"expected END opcode after element expression");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8f])();
          bVar1 = Succeeded(RVar2);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"EndElemSegment callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x90])();
        bVar1 = Succeeded(RVar2);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndElemSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnElemSegmentCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginElemSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadElemSection(Offset section_size) {
  CALLBACK(BeginElemSection, section_size);
  Index num_elem_segments;
  CHECK_RESULT(ReadCount(&num_elem_segments, "elem segment count"));
  CALLBACK(OnElemSegmentCount, num_elem_segments);
  for (Index i = 0; i < num_elem_segments; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "elem segment flags"));
    ERROR_IF(flags > SegFlagMax, "invalid elem segment flags: %#x", flags);
    Index table_index(0);
    if ((flags & (SegPassive | SegExplicitIndex)) == SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&table_index, "elem segment table index"));
    }
    Type elem_type = Type::Funcref;

    CALLBACK(BeginElemSegment, i, table_index, flags);

    if (!(flags & SegPassive)) {
      CALLBACK(BeginElemSegmentInitExpr, i);
      CHECK_RESULT(ReadI32InitExpr(i));
      CALLBACK(EndElemSegmentInitExpr, i);
    }

    // For backwards compat we support not declaring the element kind.
    if (flags & (SegPassive | SegExplicitIndex)) {
      if (flags & SegUseElemExprs) {
        CHECK_RESULT(ReadType(&elem_type, "table elem type"));
        ERROR_UNLESS(elem_type.IsRef(),
                     "segment elem expr type must be a reference type (got %s)",
                     elem_type.GetName());
      } else {
        ExternalKind kind;
        CHECK_RESULT(ReadExternalKind(&kind, "export kind"));
        ERROR_UNLESS(kind == ExternalKind::Func,
                     "segment elem type must be func (%s)",
                     elem_type.GetName());
        elem_type = Type::Funcref;
      }
    }

    CALLBACK(OnElemSegmentElemType, i, elem_type);

    Index num_elem_exprs;
    CHECK_RESULT(ReadCount(&num_elem_exprs, "elem count"));

    CALLBACK(OnElemSegmentElemExprCount, i, num_elem_exprs);
    for (Index j = 0; j < num_elem_exprs; ++j) {
      if (flags & SegUseElemExprs) {
        Opcode opcode;
        CHECK_RESULT(ReadOpcode(&opcode, "elem expr opcode"));
        if (opcode == Opcode::RefNull) {
          CALLBACK(OnElemSegmentElemExpr_RefNull, i);
        } else if (opcode == Opcode::RefFunc) {
          Index func_index;
          CHECK_RESULT(ReadIndex(&func_index, "elem expr func index"));
          CALLBACK(OnElemSegmentElemExpr_RefFunc, i, func_index);
        } else {
          PrintError(
              "expected ref.null or ref.func in passive element segment");
        }
        CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
        ERROR_UNLESS(opcode == Opcode::End,
                     "expected END opcode after element expression");
      } else {
        Index func_index;
        CHECK_RESULT(ReadIndex(&func_index, "elem expr func index"));
        CALLBACK(OnElemSegmentElemExpr_RefFunc, i, func_index);
      }
    }
    CALLBACK(EndElemSegment, i);
  }
  CALLBACK0(EndElemSection);
  return Result::Ok;
}